

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

int __thiscall ON_wString::ReverseFind(ON_wString *this,wchar_t c)

{
  wchar_t *pwVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ON_Internal_Empty_wString *pOVar6;
  
  iVar2 = ON_IsValidSingleElementWideCharValue(c);
  if (iVar2 != 0) {
    pwVar1 = this->m_s;
    pOVar6 = &empty_wstring;
    if (pwVar1 != (wchar_t *)0x0) {
      pOVar6 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
    }
    uVar5 = (pOVar6->header).string_length;
    uVar4 = uVar5;
    do {
      uVar3 = uVar4;
      uVar5 = uVar5 - 1;
      uVar4 = uVar3;
      if ((int)uVar3 < 1) break;
      uVar4 = uVar3 - 1;
    } while (pwVar1[uVar5] != c);
    if (0 < (int)uVar3) {
      return uVar4;
    }
  }
  return -1;
}

Assistant:

int ON_wString::ReverseFind( wchar_t c ) const
{
  if (ON_IsValidSingleElementWideCharValue(c))
  {
    // find first single character
    int i = Length();
    while( i > 0 )
    {
      if (c == m_s[--i])
        return i;
    }
  }
  return -1;
}